

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::TableModuleField::~TableModuleField(TableModuleField *this)

{
  pointer pcVar1;
  
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)5>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__TableModuleField_001a09d8;
  pcVar1 = (this->table).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->table).name.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

explicit TableModuleField(const Location& loc = Location(),
                            string_view name = string_view())
      : ModuleFieldMixin<ModuleFieldType::Table>(loc), table(name) {}